

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

bool __thiscall hanabi_learning_env::HanabiState::MoveIsLegal(HanabiState *this,HanabiMove move)

{
  HanabiMove move_00;
  HanabiMove move_01;
  anon_class_8_1_898ee8cf_for__M_pred __pred;
  anon_class_8_1_898ee8cf_for__M_pred __pred_00;
  __normal_iterator<const_hanabi_learning_env::HanabiCard_*,_std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>_>
  __first;
  __normal_iterator<const_hanabi_learning_env::HanabiCard_*,_std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>_>
  __first_00;
  int8_t iVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  HanabiGame *this_00;
  const_reference pvVar6;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *pvVar7;
  size_type sVar8;
  HanabiHand *pHVar9;
  ulong uVar10;
  HanabiState *in_RDI;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *cards_1
  ;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *cards;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  HanabiState *in_stack_ffffffffffffff60;
  int local_98;
  Type in_stack_ffffffffffffff6c;
  Type in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  __normal_iterator<const_hanabi_learning_env::HanabiCard_*,_std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>_>
  in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  HanabiMove local_c;
  
  TVar3 = HanabiMove::MoveType(&local_c);
  switch(TVar3) {
  case kPlay:
    iVar1 = HanabiMove::CardIndex(&local_c);
    uVar10 = (ulong)iVar1;
    pvVar6 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    pvVar7 = HanabiHand::Cards(pvVar6);
    sVar8 = std::
            vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
            ::size(pvVar7);
    if (sVar8 <= uVar10) {
      return false;
    }
    break;
  case kDiscard:
    iVar4 = InformationTokens(in_RDI);
    this_00 = ParentGame(in_RDI);
    iVar5 = HanabiGame::MaxInformationTokens(this_00);
    if (iVar5 <= iVar4) {
      return false;
    }
    iVar1 = HanabiMove::CardIndex(&local_c);
    local_98 = (int)iVar1;
    iVar4 = (int)(iVar1 >> 7);
    pvVar6 = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::operator[](&in_RDI->hands_,(long)in_RDI->cur_player_);
    pvVar7 = HanabiHand::Cards(pvVar6);
    sVar8 = std::
            vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
            ::size(pvVar7);
    if (sVar8 <= CONCAT44(iVar4,local_98)) {
      return false;
    }
    break;
  case kRevealColor:
    move_00.card_index_ = (char)in_stack_ffffffffffffff70;
    move_00.target_offset_ = (char)(in_stack_ffffffffffffff70 >> 8);
    move_00.color_ = (char)(in_stack_ffffffffffffff70 >> 0x10);
    move_00.rank_ = (char)(in_stack_ffffffffffffff70 >> 0x18);
    move_00.move_type_ = in_stack_ffffffffffffff6c;
    bVar2 = HintingIsLegal(in_stack_ffffffffffffff60,move_00);
    if (!bVar2) {
      return false;
    }
    HanabiMove::TargetOffset(&local_c);
    pHVar9 = HandByOffset((HanabiState *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
    HanabiHand::Cards(pHVar9);
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    begin((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
           *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    end((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *
        )CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    __first._M_current._4_4_ = in_stack_ffffffffffffff84;
    __first._M_current._0_4_ = in_stack_ffffffffffffff80;
    __pred.move.card_index_ = (char)in_stack_ffffffffffffff74;
    __pred.move.target_offset_ = (char)((uint)in_stack_ffffffffffffff74 >> 8);
    __pred.move.color_ = (char)((uint)in_stack_ffffffffffffff74 >> 0x10);
    __pred.move.rank_ = (char)((uint)in_stack_ffffffffffffff74 >> 0x18);
    __pred.move.move_type_ = in_stack_ffffffffffffff70;
    bVar2 = std::
            any_of<__gnu_cxx::__normal_iterator<hanabi_learning_env::HanabiCard_const*,std::vector<hanabi_learning_env::HanabiCard,std::allocator<hanabi_learning_env::HanabiCard>>>,hanabi_learning_env::HanabiState::MoveIsLegal(hanabi_learning_env::HanabiMove)const::__0>
                      (__first,in_stack_ffffffffffffff78,__pred);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      return false;
    }
    break;
  case kRevealRank:
    move_01.card_index_ = (char)in_stack_ffffffffffffff70;
    move_01.target_offset_ = (char)(in_stack_ffffffffffffff70 >> 8);
    move_01.color_ = (char)(in_stack_ffffffffffffff70 >> 0x10);
    move_01.rank_ = (char)(in_stack_ffffffffffffff70 >> 0x18);
    move_01.move_type_ = in_stack_ffffffffffffff6c;
    bVar2 = HintingIsLegal(in_stack_ffffffffffffff60,move_01);
    if (!bVar2) {
      return false;
    }
    HanabiMove::TargetOffset(&local_c);
    pHVar9 = HandByOffset((HanabiState *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
    HanabiHand::Cards(pHVar9);
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    begin((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
           *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    end((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *
        )CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    __first_00._M_current._4_4_ = in_stack_ffffffffffffff84;
    __first_00._M_current._0_4_ = in_stack_ffffffffffffff80;
    __pred_00.move.card_index_ = (char)in_stack_ffffffffffffff74;
    __pred_00.move.target_offset_ = (char)((uint)in_stack_ffffffffffffff74 >> 8);
    __pred_00.move.color_ = (char)((uint)in_stack_ffffffffffffff74 >> 0x10);
    __pred_00.move.rank_ = (char)((uint)in_stack_ffffffffffffff74 >> 0x18);
    __pred_00.move.move_type_ = in_stack_ffffffffffffff70;
    bVar2 = std::
            any_of<__gnu_cxx::__normal_iterator<hanabi_learning_env::HanabiCard_const*,std::vector<hanabi_learning_env::HanabiCard,std::allocator<hanabi_learning_env::HanabiCard>>>,hanabi_learning_env::HanabiState::MoveIsLegal(hanabi_learning_env::HanabiMove)const::__1>
                      (__first_00,in_stack_ffffffffffffff78,__pred_00);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      return false;
    }
    break;
  case kDeal:
    if (in_RDI->cur_player_ != -1) {
      return false;
    }
    HanabiMove::Color(&local_c);
    HanabiMove::Rank(&local_c);
    iVar4 = HanabiDeck::CardCount
                      ((HanabiDeck *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                       in_stack_ffffffffffffff58);
    if (iVar4 == 0) {
      return false;
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool HanabiState::MoveIsLegal(HanabiMove move) const {
  switch (move.MoveType()) {
    case HanabiMove::kDeal:
      if (cur_player_ != kChancePlayerId) {
        return false;
      }
      if (deck_.CardCount(move.Color(), move.Rank()) == 0) {
        return false;
      }
      break;
    case HanabiMove::kDiscard:
      if (InformationTokens() >= ParentGame()->MaxInformationTokens()) {
        return false;
      }
      if (move.CardIndex() >= hands_[cur_player_].Cards().size()) {
        return false;
      }
      break;
    case HanabiMove::kPlay:
      if (move.CardIndex() >= hands_[cur_player_].Cards().size()) {
        return false;
      }
      break;
    case HanabiMove::kRevealColor: {
      if (!HintingIsLegal(move)) {
        return false;
      }
      const auto& cards = HandByOffset(move.TargetOffset()).Cards();
      if (!std::any_of(cards.begin(), cards.end(),
                       [move](const HanabiCard& card) {
                         return card.Color() == move.Color();
                       })) {
        return false;
      }
      break;
    }
    case HanabiMove::kRevealRank: {
      if (!HintingIsLegal(move)) {
        return false;
      }
      const auto& cards = HandByOffset(move.TargetOffset()).Cards();
      if (!std::any_of(cards.begin(), cards.end(),
                       [move](const HanabiCard& card) {
                         return card.Rank() == move.Rank();
                       })) {
        return false;
      }
      break;
    }
    default:
      return false;
  }
  return true;
}